

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O3

string * __thiscall Node::OutputNewDefinition_abi_cxx11_(string *__return_storage_ptr__,Node *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  VariableStruct *this_00;
  undefined8 *puVar4;
  long *plVar5;
  char *pcVar6;
  ulong *puVar7;
  size_type *psVar8;
  undefined8 uVar9;
  _Alloc_hider _Var10;
  char buffer [16];
  string local_b8;
  string local_90;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar3 = this->Type;
  pcVar6 = "void ";
  bVar2 = true;
  if (iVar3 < 0x1a1) {
    if (iVar3 < 0x14e) {
      if (iVar3 - 0x125U < 2) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        if (iVar3 != 0x143) goto LAB_00117e7b;
        OutputNodeVarType_abi_cxx11_(&local_90,this->Tree[0]);
        puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
        puVar7 = puVar4 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar7) {
          local_b8.field_2._M_allocated_capacity = *puVar7;
          local_b8.field_2._8_8_ = puVar4[3];
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        }
        else {
          local_b8.field_2._M_allocated_capacity = *puVar7;
          local_b8._M_dataplus._M_p = (pointer)*puVar4;
        }
        local_b8._M_string_length = puVar4[1];
        *puVar4 = puVar7;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        uVar9 = local_90.field_2._M_allocated_capacity;
        _Var10._M_p = local_90._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p == &local_90.field_2) goto LAB_00117e78;
LAB_00117e70:
        operator_delete(_Var10._M_p,uVar9 + 1);
      }
LAB_00117e78:
      bVar2 = false;
    }
    else if ((iVar3 == 0x14e) || (iVar3 == 0x17c)) goto LAB_00117c06;
  }
  else {
    if (iVar3 < 0x1fe) {
      if (iVar3 != 0x1a1) {
        if (iVar3 != 0x1fd) goto LAB_00117e7b;
        paVar1 = &local_70.field_2;
        local_70._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"extern ","");
        OutputNodeVarType_abi_cxx11_(&local_50,this->Tree[0]);
        uVar9 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar1) {
          uVar9 = local_70.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar9 < local_50._M_string_length + local_70._M_string_length) {
          uVar9 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            uVar9 = local_50.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar9 < local_50._M_string_length + local_70._M_string_length)
          goto LAB_00117b0d;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_50,0,(char *)0x0,(ulong)local_70._M_dataplus._M_p);
        }
        else {
LAB_00117b0d:
          puVar4 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_70,(ulong)local_50._M_dataplus._M_p);
        }
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        puVar7 = puVar4 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar7) {
          local_90.field_2._M_allocated_capacity = *puVar7;
          local_90.field_2._8_8_ = puVar4[3];
        }
        else {
          local_90.field_2._M_allocated_capacity = *puVar7;
          local_90._M_dataplus._M_p = (pointer)*puVar4;
        }
        local_90._M_string_length = puVar4[1];
        *puVar4 = puVar7;
        puVar4[1] = 0;
        *(undefined1 *)puVar7 = 0;
        puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
        puVar7 = puVar4 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar7) {
          local_b8.field_2._M_allocated_capacity = *puVar7;
          local_b8.field_2._8_8_ = puVar4[3];
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        }
        else {
          local_b8.field_2._M_allocated_capacity = *puVar7;
          local_b8._M_dataplus._M_p = (pointer)*puVar4;
        }
        local_b8._M_string_length = puVar4[1];
        *puVar4 = puVar7;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        uVar9 = local_70.field_2._M_allocated_capacity;
        _Var10._M_p = local_70._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar1) goto LAB_00117e70;
        goto LAB_00117e78;
      }
    }
    else {
      if (iVar3 != 0x1fe) {
        if (iVar3 == 0x1ff) {
          OutputNodeVarType_abi_cxx11_(&local_70,this->Tree[0]);
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x12db66);
          puVar7 = puVar4 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar7) {
            local_90.field_2._M_allocated_capacity = *puVar7;
            local_90.field_2._8_8_ = puVar4[3];
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          }
          else {
            local_90.field_2._M_allocated_capacity = *puVar7;
            local_90._M_dataplus._M_p = (pointer)*puVar4;
          }
          local_90._M_string_length = puVar4[1];
          *puVar4 = puVar7;
          puVar4[1] = 0;
          *(undefined1 *)(puVar4 + 2) = 0;
          puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
          puVar7 = puVar4 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar7) {
            local_b8.field_2._M_allocated_capacity = *puVar7;
            local_b8.field_2._8_8_ = puVar4[3];
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          }
          else {
            local_b8.field_2._M_allocated_capacity = *puVar7;
            local_b8._M_dataplus._M_p = (pointer)*puVar4;
          }
          local_b8._M_string_length = puVar4[1];
          *puVar4 = puVar7;
          puVar4[1] = 0;
          *(undefined1 *)(puVar4 + 2) = 0;
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
        }
        goto LAB_00117e7b;
      }
      pcVar6 = "extern void ";
    }
LAB_00117c06:
    bVar2 = false;
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar6);
  }
LAB_00117e7b:
  this_00 = VariableList::Lookup(Variables,&this->Tree[1]->TextValue,this->Tree[3],0);
  if (this_00 == (VariableStruct *)0x0) {
    std::operator+(&local_90,"?",&this->Tree[1]->TextValue);
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
    puVar7 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar7) {
      local_b8.field_2._M_allocated_capacity = *puVar7;
      local_b8.field_2._8_8_ = puVar4[3];
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    }
    else {
      local_b8.field_2._M_allocated_capacity = *puVar7;
      local_b8._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_b8._M_string_length = puVar4[1];
    *puVar4 = puVar7;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b8._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    uVar9 = local_90.field_2._M_allocated_capacity;
    _Var10._M_p = local_90._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) goto LAB_00117f86;
  }
  else {
    VariableStruct::GetName_abi_cxx11_(&local_b8,this_00,0);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b8._M_dataplus._M_p)
    ;
    uVar9 = local_b8.field_2._M_allocated_capacity;
    _Var10._M_p = local_b8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
LAB_00117f86:
      operator_delete(_Var10._M_p,uVar9 + 1);
    }
  }
  if (this->Type - 0x125U < 2) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (this->Tree[3] == (Node *)0x0) {
    if (bVar2) goto LAB_001180e9;
  }
  else {
    if (bVar2) {
      iVar3 = IsSimpleInteger(this->Tree[3]);
      if (iVar3 == 0) {
        OutputForcedType_abi_cxx11_(&local_70,this->Tree[3],VARTYPE_INTEGER);
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x12dc3e);
        puVar7 = puVar4 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar7) {
          local_90.field_2._M_allocated_capacity = *puVar7;
          local_90.field_2._8_8_ = puVar4[3];
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        }
        else {
          local_90.field_2._M_allocated_capacity = *puVar7;
          local_90._M_dataplus._M_p = (pointer)*puVar4;
        }
        local_90._M_string_length = puVar4[1];
        *puVar4 = puVar7;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
        puVar7 = puVar4 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar7) {
          local_b8.field_2._M_allocated_capacity = *puVar7;
          local_b8.field_2._8_8_ = puVar4[3];
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        }
        else {
          local_b8.field_2._M_allocated_capacity = *puVar7;
          local_b8._M_dataplus._M_p = (pointer)*puVar4;
        }
        local_b8._M_string_length = puVar4[1];
        *puVar4 = puVar7;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_b8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        iVar3 = atoi((this->Tree[3]->TextValue)._M_dataplus._M_p);
        sprintf((char *)&local_b8,"[%d]",(ulong)(iVar3 + 1));
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      goto LAB_001180e9;
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (this->Tree[3] == (Node *)0x0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      OutputDefinitionParams_abi_cxx11_(&local_b8,this->Tree[3],(Node *)0x0,0x1f5,0);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_b8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_001180e9:
  if (this->Tree[4] != (Node *)0x0) {
    Expression_abi_cxx11_(&local_90,this->Tree[4]);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x12d5d5);
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_b8.field_2._M_allocated_capacity = *psVar8;
      local_b8.field_2._8_8_ = plVar5[3];
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    }
    else {
      local_b8.field_2._M_allocated_capacity = *psVar8;
      local_b8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_b8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b8._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Node::OutputNewDefinition(void)
{
	VariableStruct *ThisVar;
	int IsFunction = 0;
	std::string result;

	//
	// Handle class and type
	//
	switch(Type)
	{
	case BAS_N_EXTERNALFUNCTION:
		IsFunction = 1;
		result = std::string("extern ") + Tree[0]->OutputNodeVarType() + " ";
		break;

	case BAS_N_EXTERNALSUB:
		IsFunction = 1;
		result = "extern void ";
		break;

	case BAS_S_FUNCTION:
		IsFunction = 1;
		result = Tree[0]->OutputNodeVarType() + " ";
		break;

	case BAS_S_DEF:
	case BAS_S_DEFSTAR:
		IsFunction = 1;
		result += "auto ";
		break;

	case BAS_N_EXTERNALCONSTANT:
		result = "extern const " + Tree[0]->OutputNodeVarType() + " ";
		break;

	case BAS_S_SUB:
	case BAS_S_PROGRAM:
		IsFunction = 1;
		result = "void ";
		break;

	case BAS_S_HANDLER:
		IsFunction = 1;
		result = "void ";
		break;
	}

	//
	// Look for variable in table
	//
	ThisVar = Variables->Lookup(Tree[1]->TextValue, Tree[3]);

	//
	// Make up a good name to print for this variable/function
	//
	if (ThisVar != 0)
	{
		result += ThisVar->GetName();
	}
	else
	{
		result += "?" + Tree[1]->TextValue + "?";
	}

	//
	// Lambda function for DEF
	//
	switch(Type)
	{
	case BAS_S_DEF:
	case BAS_S_DEFSTAR:
		result += " = [&]";
		break;
	}

	if (Tree[3] != 0)
	{
		if (IsFunction == 0)
		{
			//
			// Handle references (Function or array)
			// (May need to be modified from x[a,b]
			// to x[a][b] manually.
			//
			if (Tree[3] != 0)
			{
				if (Tree[3]->IsSimpleInteger())
				{
					// FIXME: Isn't there a better way?
					char buffer[16];
					sprintf(buffer, "[%d]",
						(atoi(Tree[3]->TextValue.c_str()) + 1));
					result += buffer;
				}
				else
				{
					result += "[" +
						Tree[3]->OutputForcedType(VARTYPE_INTEGER) + " + 1]";
				}
			}
		}
		else
		{
			//
			// Handle references (Function)
			//
			result += "(";

			if (Tree[3] != 0)
			{
				result += Tree[3]->OutputDefinitionParams(0, BAS_N_LIST);
			}
			else
			{
				result += "...";
			}

			result += ")";
		}
	}
	else
	{
		if (IsFunction != 0)
		{
			result += "(void)";
		}
	}

	//
	// Output any constant definitions
	//
	if (Tree[4] != 0)
	{
		result += " = " + Tree[4]->Expression();
	}

	return result;
}